

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O3

Gia_Man_t * Gia_ManRetimeDupForward(Gia_Man_t *p,Vec_Ptr_t *vCut)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  undefined8 *puVar5;
  void **ppvVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Man_t *pGVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  Gia_ManHashAlloc(p_00);
  Gia_ManFillValue(p);
  Gia_ManSetPhase(p);
  p->pObjs->Value = 0;
  pVVar12 = p->vCis;
  uVar15 = (ulong)(uint)pVVar12->nSize;
  if (p->nRegs < pVVar12->nSize) {
    lVar19 = 0;
    do {
      if ((int)uVar15 <= lVar19) goto LAB_007b3bba;
      iVar14 = pVVar12->pArray[lVar19];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_007b3b7c;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar11 = p_00->pObjs;
      if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_007b3b5d;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * -0x55555555);
      pGVar11 = p_00->pObjs;
      if ((pGVar10 < pGVar11) || (pGVar11 + p_00->nObjs <= pGVar10)) goto LAB_007b3b5d;
      pGVar4[iVar14].Value = (int)((ulong)((long)pGVar10 - (long)pGVar11) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
      pVVar12 = p->vCis;
      uVar15 = (ulong)pVVar12->nSize;
    } while (lVar19 < (long)(uVar15 - (long)p->nRegs));
  }
  if (0 < vCut->nSize) {
    lVar19 = 0;
    do {
      puVar5 = (undefined8 *)vCut->pArray[lVar19];
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_007b3b5d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_007b3b5d;
      uVar7 = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      if ((int)uVar7 < 0) goto LAB_007b3b9b;
      *(uint *)(puVar5 + 1) = uVar7 | (uint)((ulong)*puVar5 >> 0x3f);
      lVar19 = lVar19 + 1;
    } while (lVar19 < vCut->nSize);
  }
  pVVar12 = p->vCos;
  uVar15 = (ulong)(uint)pVVar12->nSize;
  if (0 < pVVar12->nSize) {
    lVar19 = 0;
    do {
      iVar14 = pVVar12->pArray[lVar19];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_007b3b7c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar14;
      Gia_ManRetimeDup_rec(p_00,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
      lVar19 = lVar19 + 1;
      pVVar12 = p->vCos;
      uVar15 = (ulong)pVVar12->nSize;
    } while (lVar19 < (long)uVar15);
  }
  uVar7 = p->nRegs;
  uVar17 = (uint)uVar15;
  uVar16 = (ulong)(uVar17 - uVar7);
  if (uVar17 - uVar7 != 0 && (int)uVar7 <= (int)uVar17) {
    lVar19 = 0;
    do {
      uVar17 = (uint)uVar15;
      if ((int)uVar17 <= lVar19) goto LAB_007b3bba;
      iVar14 = pVVar12->pArray[lVar19];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_007b3b7c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar14;
      uVar17 = (uint)*(undefined8 *)pGVar4;
      uVar7 = pGVar4[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar7 < 0) goto LAB_007b3b9b;
      Gia_ManAppendCo(p_00,uVar17 >> 0x1d & 1 ^ uVar7);
      lVar19 = lVar19 + 1;
      uVar7 = p->nRegs;
      pVVar12 = p->vCos;
      uVar17 = pVVar12->nSize;
      uVar15 = (ulong)uVar17;
      uVar16 = (ulong)(uVar17 - uVar7);
    } while (lVar19 < (int)(uVar17 - uVar7));
  }
  if (0 < (int)uVar7) {
    lVar19 = (long)(int)uVar16;
    uVar18 = (ulong)uVar7;
    uVar15 = uVar18;
    do {
      if (((int)uVar16 < 0) || ((int)uVar17 <= lVar19)) goto LAB_007b3bba;
      iVar14 = pVVar12->pArray[lVar19];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_007b3b7c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar14;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
      goto LAB_007b3b9b;
      pGVar4->Value =
           (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
           pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value;
      lVar19 = lVar19 + 1;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    if (0 < (int)uVar7) {
      iVar14 = -uVar7;
LAB_007b3a18:
      if ((long)(int)uVar17 <= (long)uVar16) {
LAB_007b3bba:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar12->pArray[uVar16];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_007b3b7c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      if (pGVar4 != (Gia_Obj_t *)0x0) {
        iVar2 = p->vCis->nSize;
        uVar7 = iVar14 + iVar2;
        if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) goto LAB_007b3bba;
        uVar7 = p->vCis->pArray[uVar7];
        if (((long)(int)uVar7 < 0) || ((uint)p->nObjs <= uVar7)) goto LAB_007b3b7c;
        pGVar4[(int)uVar7].Value = pGVar4[iVar1].Value;
        iVar14 = iVar14 + 1;
        uVar16 = uVar16 + 1;
        uVar18 = uVar18 - 1;
        if (uVar18 != 0) goto LAB_007b3a18;
      }
    }
  }
  iVar14 = vCut->nSize;
  if (0 < (long)iVar14) {
    ppvVar6 = vCut->pArray;
    lVar19 = 0;
    do {
      uVar7 = *ppvVar6[lVar19];
      if ((~uVar7 & 0x1fffffff) != 0 && -1 < (int)uVar7) {
        *(uint *)((long)ppvVar6[lVar19] + 8) = 0xffffffff;
      }
      lVar19 = lVar19 + 1;
    } while (iVar14 != lVar19);
    if (0 < iVar14) {
      lVar19 = 0;
      do {
        pGVar4 = (Gia_Obj_t *)vCut->pArray[lVar19];
        Gia_ManRetimeDup_rec(p_00,pGVar4);
        if ((int)pGVar4->Value < 0) {
LAB_007b3b9b:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        Gia_ManAppendCo(p_00,pGVar4->Value ^ (uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
        lVar19 = lVar19 + 1;
      } while (lVar19 < vCut->nSize);
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,vCut->nSize);
  pGVar13 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar13;
}

Assistant:

Gia_Man_t * Gia_ManRetimeDupForward( Gia_Man_t * p, Vec_Ptr_t * vCut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // create the true PIs
    Gia_ManFillValue( p );
    Gia_ManSetPhase( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create the registers
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), pObj->fPhase );
    // duplicate logic above the cut
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManRetimeDup_rec( pNew, Gia_ObjFanin0(pObj) );
    // create the true POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // remember value in LI
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // transfer values from the LIs to the LOs
    Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
        pObjRo->Value = pObjRi->Value;
    // erase the data values on the internal nodes of the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = ~0;
    // duplicate logic below the cut
    Vec_PtrForEachEntry( Gia_Obj_t *, vCut, pObj, i )
    {
        Gia_ManRetimeDup_rec( pNew, pObj );
        Gia_ManAppendCo( pNew, Abc_LitNotCond( pObj->Value, pObj->fPhase ) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Vec_PtrSize(vCut) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}